

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *
Catch::sortTests(vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                 *__return_storage_ptr__,IConfig *config,
                vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                *unsortedTestCases)

{
  pointer pTVar1;
  long lVar2;
  pointer ppVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  ulong uVar7;
  vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
  *__range3;
  __normal_iterator<Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  __i;
  pointer pTVar8;
  long lVar9;
  pointer ppVar10;
  pointer ppVar11;
  TestCaseHandle *handle;
  pointer pTVar12;
  vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
  indexed_tests;
  TestCaseInfoHasher h;
  ostream *local_48;
  SourceLineInfo local_40;
  
  iVar4 = (*config->_vptr_IConfig[0x10])(config);
  if (iVar4 == 2) {
    seedRng(config);
    uVar5 = (*config->_vptr_IConfig[0x11])(config);
    h.m_seed = (hash_t)uVar5;
    indexed_tests.
    super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    indexed_tests.
    super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    indexed_tests.
    super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ::reserve(&indexed_tests,
              (long)(unsortedTestCases->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(unsortedTestCases->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4);
    pTVar1 = (unsortedTestCases->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pTVar12 = (unsortedTestCases->
                   super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppVar11 = indexed_tests.
                  super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        ppVar3 = indexed_tests.
                 super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, pTVar12 != pTVar1; pTVar12 = pTVar12 + 1
        ) {
      uVar6 = TestCaseInfoHasher::operator()(&h,pTVar12->m_info);
      local_40.file = (char *)CONCAT44(local_40.file._4_4_,uVar6);
      std::
      vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>
      ::emplace_back<unsigned_int,Catch::TestCaseHandle_const&>
                ((vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>
                  *)&indexed_tests,(uint *)&local_40,pTVar12);
    }
    if (indexed_tests.
        super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        indexed_tests.
        super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar9 = (long)indexed_tests.
                    super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)indexed_tests.
                    super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = lVar9 / 0x18;
      lVar2 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCaseHandle>*,std::vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__1>>
                (indexed_tests.
                 super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 indexed_tests.
                 super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar9 < 0x181) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCaseHandle>*,std::vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__1>>
                  (ppVar3,ppVar11);
      }
      else {
        ppVar10 = ppVar3 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCaseHandle>*,std::vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__1>>
                  (ppVar3,ppVar10);
        for (; ppVar10 != ppVar11; ppVar10 = ppVar10 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCaseHandle>*,std::vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>>,__gnu_cxx::__ops::_Val_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__1>>
                    (ppVar10);
        }
      }
    }
    (__return_storage_ptr__->
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::reserve
              (__return_storage_ptr__,
               ((long)indexed_tests.
                      super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)indexed_tests.
                     super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    ppVar3 = indexed_tests.
             super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar11 = indexed_tests.
                   super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar3;
        ppVar11 = ppVar11 + 1) {
      std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::push_back
                (__return_storage_ptr__,&ppVar11->second);
    }
    std::
    _Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ::~_Vector_base(&indexed_tests.
                     super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                   );
  }
  else if (iVar4 == 1) {
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
    pTVar12 = (__return_storage_ptr__->
              super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pTVar1 = (__return_storage_ptr__->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar12 != pTVar1) {
      uVar7 = (long)pTVar1 - (long)pTVar12 >> 4;
      lVar2 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__0>>
                (pTVar12,pTVar1,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pTVar1 - (long)pTVar12 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__0>>
                  (pTVar12,pTVar1);
      }
      else {
        pTVar8 = pTVar12 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__0>>
                  (pTVar12,pTVar8);
        for (; pTVar8 != pTVar1; pTVar8 = pTVar8 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,__gnu_cxx::__ops::_Val_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__0>>
                    (pTVar8);
        }
      }
    }
  }
  else {
    if (iVar4 != 0) {
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&h);
      local_40.file =
           "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
      ;
      local_40.line = 0x1850;
      operator<<(local_48,&local_40);
      std::operator<<(local_48,": Internal Catch2 error: ");
      std::operator<<(local_48,"Unknown test order value!");
      std::__cxx11::stringbuf::str();
      throw_logic_error((string *)&indexed_tests);
    }
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestCaseHandle> sortTests( IConfig const& config, std::vector<TestCaseHandle> const& unsortedTestCases ) {
        switch (config.runOrder()) {
        case TestRunOrder::Declared:
            return unsortedTestCases;

        case TestRunOrder::LexicographicallySorted: {
            std::vector<TestCaseHandle> sorted = unsortedTestCases;
            std::sort(
                sorted.begin(),
                sorted.end(),
                []( TestCaseHandle const& lhs, TestCaseHandle const& rhs ) {
                    return lhs.getTestCaseInfo() < rhs.getTestCaseInfo();
                }
            );
            return sorted;
        }
        case TestRunOrder::Randomized: {
            seedRng(config);
            using TestWithHash = std::pair<TestCaseInfoHasher::hash_t, TestCaseHandle>;

            TestCaseInfoHasher h{ config.rngSeed() };
            std::vector<TestWithHash> indexed_tests;
            indexed_tests.reserve(unsortedTestCases.size());

            for (auto const& handle : unsortedTestCases) {
                indexed_tests.emplace_back(h(handle.getTestCaseInfo()), handle);
            }

            std::sort( indexed_tests.begin(),
                       indexed_tests.end(),
                       []( TestWithHash const& lhs, TestWithHash const& rhs ) {
                           if ( lhs.first == rhs.first ) {
                               return lhs.second.getTestCaseInfo() <
                                      rhs.second.getTestCaseInfo();
                           }
                           return lhs.first < rhs.first;
                       } );

            std::vector<TestCaseHandle> randomized;
            randomized.reserve(indexed_tests.size());

            for (auto const& indexed : indexed_tests) {
                randomized.push_back(indexed.second);
            }

            return randomized;
        }
        }

        CATCH_INTERNAL_ERROR("Unknown test order value!");
    }